

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptSymbol::ToString(PropertyRecord *propertyRecord,ScriptContext *requestContext)

{
  charcount_t appendCharLength;
  char16 *s;
  JavascriptLibrary *library;
  CompoundString *this;
  CompoundString *str;
  uint len;
  char16 *description;
  ScriptContext *requestContext_local;
  PropertyRecord *propertyRecord_local;
  
  s = PropertyRecord::GetBuffer(propertyRecord);
  appendCharLength = PropertyRecord::GetLength(propertyRecord);
  library = ScriptContext::GetLibrary(requestContext);
  this = CompoundString::NewWithCharCapacity(appendCharLength + 9,library);
  CompoundString::AppendChars(this,L"Symbol(",7);
  CompoundString::AppendChars(this,s,appendCharLength);
  CompoundString::AppendChars(this,L')');
  return (JavascriptString *)this;
}

Assistant:

JavascriptString* JavascriptSymbol::ToString(const PropertyRecord* propertyRecord, ScriptContext * requestContext)
    {
        const char16* description = propertyRecord->GetBuffer();
        uint len = propertyRecord->GetLength();
        CompoundString* str = CompoundString::NewWithCharCapacity(len + _countof(_u("Symbol()")), requestContext->GetLibrary());

        str->AppendChars(_u("Symbol("), _countof(_u("Symbol(")) - 1);
        str->AppendChars(description, len);
        str->AppendChars(_u(')'));

        return str;
    }